

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::verifyImage
          (SampleMaskWriteCase *this,Surface *resultImage)

{
  Surface *resultImage_00;
  int iVar1;
  RenderTarget *this_00;
  TestLog *pTVar2;
  bool local_d9;
  byte local_cd;
  Vector<float,_3> local_cc;
  ColorVerifier local_c0;
  Vector<float,_3> local_a4;
  ColorVerifier local_98;
  Verifier local_80;
  Vector<float,_3> local_74;
  ColorVerifier local_68;
  Vector<float,_3> local_4c;
  ColorVerifier local_40;
  byte local_21;
  Surface *pSStack_20;
  bool singleSampleTarget;
  Surface *resultImage_local;
  SampleMaskWriteCase *this_local;
  
  local_cd = 0;
  pSStack_20 = resultImage;
  resultImage_local = (Surface *)this;
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    local_d9 = false;
    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        m_renderTarget == TARGET_DEFAULT) {
      this_00 = Context::getRenderTarget
                          ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                           super_MultisampleRenderCase.super_TestCase.m_context);
      iVar1 = tcu::RenderTarget::getNumSamples(this_00);
      local_d9 = 1 < iVar1;
    }
    local_cd = local_d9 ^ 0xff;
  }
  resultImage_00 = pSStack_20;
  local_21 = local_cd & 1;
  if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 0) {
    if (local_21 == 0) {
      if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          m_numTargetSamples == 1) {
        pTVar2 = tcu::TestContext::getLog
                           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                            super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode
                            .m_testCtx);
        tcu::Vector<float,_3>::Vector(&local_74,0.0,0.0,0.0);
        ColorVerifier::ColorVerifier(&local_68,&local_74,8);
        this_local._7_1_ =
             verifyImageWithVerifier(resultImage_00,pTVar2,&local_68.super_Verifier,true);
      }
      else {
        pTVar2 = tcu::TestContext::getLog
                           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                            super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode
                            .m_testCtx);
        PartialDiscardVerifier::PartialDiscardVerifier((PartialDiscardVerifier *)&local_80);
        this_local._7_1_ = verifyImageWithVerifier(resultImage_00,pTVar2,&local_80,true);
      }
    }
    else {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::Vector<float,_3>::Vector(&local_4c,0.0,1.0,0.0);
      ColorVerifier::ColorVerifier(&local_40,&local_4c,8);
      this_local._7_1_ =
           verifyImageWithVerifier(resultImage_00,pTVar2,&local_40.super_Verifier,true);
    }
  }
  else if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 1) {
    if (local_21 == 0) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::Vector<float,_3>::Vector(&local_cc,0.0,0.0,0.0);
      ColorVerifier::ColorVerifier(&local_c0,&local_cc,8);
      this_local._7_1_ =
           verifyImageWithVerifier(resultImage_00,pTVar2,&local_c0.super_Verifier,true);
    }
    else {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::Vector<float,_3>::Vector(&local_a4,0.0,1.0,0.0);
      ColorVerifier::ColorVerifier(&local_98,&local_a4,8);
      this_local._7_1_ =
           verifyImageWithVerifier(resultImage_00,pTVar2,&local_98.super_Verifier,true);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SampleMaskWriteCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool singleSampleTarget = m_numRequestedSamples == 0 && !(m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() > 1);

	if (m_testMode == TEST_DISCARD)
	{
		if (singleSampleTarget)
		{
			// single sample case => multisample operations are not effective => don't discard anything
			// expect green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 1.0f, 0.0f)));
		}
		else if (m_numTargetSamples == 1)
		{
			// total discard, expect black
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f)));
		}
		else
		{
			// partial discard, expect something between black and green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), PartialDiscardVerifier());
		}
	}
	else if (m_testMode == TEST_INVERSE)
	{
		if (singleSampleTarget)
		{
			// single sample case => multisample operations are not effective => don't discard anything
			// expect green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 1.0f, 0.0f)));
		}
		else
		{
			// total discard, expect black
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f)));
		}
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}